

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O2

int gost_imit_init_cpa(EVP_MD_CTX *ctx)

{
  gost_imit_init(ctx,&Gost28147_CryptoProParamSetA);
  return 1;
}

Assistant:

static int gost_imit_init_cpa(EVP_MD_CTX *ctx)
{
    return gost_imit_init(ctx, &Gost28147_CryptoProParamSetA);
}